

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkMerge.c
# Opt level: O2

void Nwk_ManCollectCircle(Vec_Ptr_t *vStart,Vec_Ptr_t *vNext,int nFanMax)

{
  long *plVar1;
  void *pvVar2;
  long lVar3;
  int i;
  
  vNext->nSize = 0;
  for (i = 0; i < vStart->nSize; i = i + 1) {
    pvVar2 = Vec_PtrEntry(vStart,i);
    for (lVar3 = 0;
        (lVar3 < *(int *)((long)pvVar2 + 0x3c) &&
        (plVar1 = *(long **)(*(long *)((long)pvVar2 + 0x48) + lVar3 * 8), plVar1 != (long *)0x0));
        lVar3 = lVar3 + 1) {
      if (((*(uint *)(plVar1 + 4) & 7) == 3) && ((int)plVar1[5] != *(int *)(*plVar1 + 0x68))) {
        *(int *)(plVar1 + 5) = *(int *)(*plVar1 + 0x68);
        Vec_PtrPush(vNext,plVar1);
      }
    }
    lVar3 = 0;
    while (((int)lVar3 < *(int *)((long)pvVar2 + 0x40) &&
           (plVar1 = *(long **)(*(long *)((long)pvVar2 + 0x48) +
                               (*(int *)((long)pvVar2 + 0x3c) + lVar3) * 8), plVar1 != (long *)0x0))
          ) {
      if ((((*(uint *)(plVar1 + 4) & 7) == 3) && ((int)plVar1[5] != *(int *)(*plVar1 + 0x68))) &&
         (*(int *)(plVar1 + 5) = *(int *)(*plVar1 + 0x68), (int)plVar1[8] <= nFanMax)) {
        Vec_PtrPush(vNext,plVar1);
      }
      lVar3 = lVar3 + 1;
    }
  }
  return;
}

Assistant:

void Nwk_ManCollectCircle( Vec_Ptr_t * vStart, Vec_Ptr_t * vNext, int nFanMax )
{
    Nwk_Obj_t * pObj, * pNext;
    int i, k;
    Vec_PtrClear( vNext );
    Vec_PtrForEachEntry( Nwk_Obj_t *, vStart, pObj, i )
    {
        Nwk_ObjForEachFanin( pObj, pNext, k )
        {
            if ( !Nwk_ObjIsNode(pNext) )
                continue;
            if ( Nwk_ObjIsTravIdCurrent( pNext ) )
                continue;
            Nwk_ObjSetTravIdCurrent( pNext );
            Vec_PtrPush( vNext, pNext );
        }
        Nwk_ObjForEachFanout( pObj, pNext, k )
        {
            if ( !Nwk_ObjIsNode(pNext) )
                continue;
            if ( Nwk_ObjIsTravIdCurrent( pNext ) )
                continue;
            Nwk_ObjSetTravIdCurrent( pNext );
            if ( Nwk_ObjFanoutNum(pNext) > nFanMax )
                continue;
            Vec_PtrPush( vNext, pNext );
        }
    }
}